

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_numberK(FuncState *fs,lua_Number r)

{
  int iVar1;
  TValue *local_78;
  TValue *io_1;
  TValue kv;
  lua_Number k;
  lua_Number q;
  int nbm;
  TValue *io;
  lua_Integer ik;
  TValue o;
  lua_Number r_local;
  FuncState *fs_local;
  
  o.value_.ub = '\x13';
  o._8_8_ = r;
  ik = (lua_Integer)r;
  iVar1 = luaV_flttointeger(r,(lua_Integer *)&io,F2Ieq);
  if (iVar1 == 0) {
    fs_local._4_4_ = addk(fs,(TValue *)&ik,(TValue *)&ik);
  }
  else {
    local_78 = (TValue *)ldexp(1.0,-0x34);
    if (io != (TValue *)0x0) {
      local_78 = (TValue *)((double)o._8_8_ * (double)local_78 + (double)o._8_8_);
    }
    kv._8_8_ = local_78;
    io_1 = local_78;
    kv.value_.ub = '\x13';
    fs_local._4_4_ = addk(fs,(TValue *)&io_1,(TValue *)&ik);
  }
  return fs_local._4_4_;
}

Assistant:

static int luaK_numberK (FuncState *fs, lua_Number r) {
  TValue o;
  lua_Integer ik;
  setfltvalue(&o, r);
  if (!luaV_flttointeger(r, &ik, F2Ieq))  /* not an integral value? */
    return addk(fs, &o, &o);  /* use number itself as key */
  else {  /* must build an alternative key */
    const int nbm = l_floatatt(MANT_DIG);
    const lua_Number q = l_mathop(ldexp)(l_mathop(1.0), -nbm + 1);
    const lua_Number k = (ik == 0) ? q : r + r*q;  /* new key */
    TValue kv;
    setfltvalue(&kv, k);
    /* result is not an integral value, unless value is too large */
    lua_assert(!luaV_flttointeger(k, &ik, F2Ieq) ||
                l_mathop(fabs)(r) >= l_mathop(1e6));
    return addk(fs, &kv, &o);
  }
}